

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentence.h
# Opt level: O0

Sentence * __thiscall
jhu::thrax::split(Sentence *__return_storage_ptr__,thrax *this,string_view line)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  const_iterator pvVar4;
  const_iterator pvVar5;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  size_type local_68;
  size_t len;
  char *local_58;
  char *e;
  char *local_48;
  char *s;
  undefined1 local_2a;
  long local_28;
  difference_type spaces;
  string_view line_local;
  Sentence *result;
  
  line_local._M_len = line._M_len;
  spaces = (difference_type)this;
  line_local._M_str = (char *)__return_storage_ptr__;
  pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                     ((basic_string_view<char,_std::char_traits<char>_> *)&spaces);
  pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::end
                     ((basic_string_view<char,_std::char_traits<char>_> *)&spaces);
  local_28 = std::count_if<char_const*,jhu::thrax::__0>(pvVar4,pvVar5);
  local_2a = 0;
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(__return_storage_ptr__);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::reserve(__return_storage_ptr__,local_28 + 1);
  if ((split(std::basic_string_view<char,std::char_traits<char>>)::notSpace == '\0') &&
     (iVar3 = __cxa_guard_acquire(&split(std::basic_string_view<char,std::char_traits<char>>)::
                                   notSpace), iVar3 != 0)) {
    std::not_fn<jhu::thrax::__0_const&>((anon_class_1_0_00000001 *)&isSpace);
    __cxa_guard_release(&split(std::basic_string_view<char,std::char_traits<char>>)::notSpace);
  }
  pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                     ((basic_string_view<char,_std::char_traits<char>_> *)&spaces);
  pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::end
                     ((basic_string_view<char,_std::char_traits<char>_> *)&spaces);
  e._7_1_ = split(std::basic_string_view<char,std::char_traits<char>>)::notSpace;
  local_58 = std::find_if<char_const*,std::_Not_fn<jhu::thrax::__0>>(pvVar4,pvVar5);
  local_48 = local_58;
  while (pcVar1 = local_48,
        pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::end
                           ((basic_string_view<char,_std::char_traits<char>_> *)&spaces),
        pcVar2 = local_48, pcVar1 < pvVar4) {
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::end
                       ((basic_string_view<char,_std::char_traits<char>_> *)&spaces);
    local_58 = std::find_if<char_const*,jhu::thrax::__0>(pcVar2,pvVar4);
    local_68 = std::distance<char_const*>(local_48,local_58);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_78,local_48,local_68);
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::push_back(__return_storage_ptr__,&local_78);
    pcVar1 = local_58;
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::end
                       ((basic_string_view<char,_std::char_traits<char>_> *)&spaces);
    local_48 = std::find_if<char_const*,std::_Not_fn<jhu::thrax::__0>>(pcVar1,pvVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Sentence split(std::string_view line) {
  auto spaces = std::count_if(line.begin(), line.end(), isSpace);
  Sentence result;
  result.reserve(spaces + 1);  // estimate
  static const auto notSpace = std::not_fn(isSpace);
  auto s = std::find_if(line.begin(), line.end(), notSpace);
  for (auto e = s; s < line.end(); s = std::find_if(e, line.end(), notSpace)) {
    e = std::find_if(s, line.end(), isSpace);
    size_t len = std::distance(s, e);
    result.push_back({ s, len });
  }
  return result;
}